

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<deqp::egl::ColorClearThread>::SharedPtr
          (SharedPtr<deqp::egl::ColorClearThread> *this,ColorClearThread *ptr)

{
  ColorClearThread *pCVar1;
  SharedPtrState<deqp::egl::ColorClearThread,_de::DefaultDeleter<deqp::egl::ColorClearThread>_>
  *pSVar2;
  DefaultDeleter<deqp::egl::ColorClearThread> local_25 [13];
  ColorClearThread *local_18;
  ColorClearThread *ptr_local;
  SharedPtr<deqp::egl::ColorClearThread> *this_local;
  
  this->m_ptr = (ColorClearThread *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (ColorClearThread *)this;
  pSVar2 = (SharedPtrState<deqp::egl::ColorClearThread,_de::DefaultDeleter<deqp::egl::ColorClearThread>_>
            *)operator_new(0x20);
  pCVar1 = local_18;
  DefaultDeleter<deqp::egl::ColorClearThread>::DefaultDeleter(local_25);
  SharedPtrState<deqp::egl::ColorClearThread,_de::DefaultDeleter<deqp::egl::ColorClearThread>_>::
  SharedPtrState(pSVar2,pCVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}